

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O2

FT_Error tt_face_goto_table(TT_Face face,FT_ULong tag,FT_Stream stream,FT_ULong *length)

{
  FT_Error FVar1;
  TT_Table pTVar2;
  
  pTVar2 = tt_face_lookup_table(face,tag);
  if (pTVar2 != (TT_Table)0x0) {
    if (length != (FT_ULong *)0x0) {
      *length = pTVar2->Length;
    }
    FVar1 = FT_Stream_Seek(stream,pTVar2->Offset);
    return FVar1;
  }
  return 0x8e;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_goto_table( TT_Face    face,
                      FT_ULong   tag,
                      FT_Stream  stream,
                      FT_ULong*  length )
  {
    TT_Table  table;
    FT_Error  error;


    table = tt_face_lookup_table( face, tag );
    if ( table )
    {
      if ( length )
        *length = table->Length;

      if ( FT_STREAM_SEEK( table->Offset ) )
        goto Exit;
    }
    else
      error = FT_THROW( Table_Missing );

  Exit:
    return error;
  }